

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.h
# Opt level: O3

void __thiscall
llbuild::buildsystem::BuildNode::BuildNode(BuildNode *this,StringRef name,NodeType type)

{
  char *pcVar1;
  
  pcVar1 = name.Data;
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_00250968;
  (this->super_Node).name._M_dataplus._M_p = (pointer)&(this->super_Node).name.field_2;
  if (pcVar1 == (char *)0x0) {
    (this->super_Node).name._M_string_length = 0;
    (this->super_Node).name.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&(this->super_Node).name,pcVar1,pcVar1 + name.Length);
  }
  (this->super_Node).producers.
  super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Node).producers.
  super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Node).producers.
  super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__BuildNode_00250b30;
  this->type = type;
  this->commandTimestamp = false;
  this->mutated = false;
  (this->exclusionPatterns).contents = (char *)0x0;
  (this->exclusionPatterns).size = 0;
  (this->mustScanAfterPaths).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mustScanAfterPaths).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mustScanAfterPaths).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit BuildNode(StringRef name, NodeType type)
      : Node(name), type(type) {}